

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int nonce_function_rfc6979
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  undefined8 uVar1;
  uint uVar2;
  size_t extraout_RDX;
  size_t outlen;
  size_t extraout_RDX_00;
  uchar keydata [112];
  secp256k1_scalar msg;
  secp256k1_rfc6979_hmac_sha256 rng;
  
  secp256k1_scalar_set_b32(&msg,msg32,(int *)0x0);
  secp256k1_scalar_get_b32(keydata + 0x20,&msg);
  keydata._0_8_ = *(undefined8 *)key32;
  keydata._8_8_ = *(undefined8 *)(key32 + 8);
  keydata._16_8_ = *(undefined8 *)(key32 + 0x10);
  keydata._24_8_ = *(undefined8 *)(key32 + 0x18);
  if (data == (void *)0x0) {
    uVar2 = 0x40;
  }
  else {
    keydata._64_8_ = *data;
    keydata._72_8_ = *(undefined8 *)((long)data + 8);
    keydata._80_8_ = *(undefined8 *)((long)data + 0x10);
    keydata._88_8_ = *(undefined8 *)((long)data + 0x18);
    uVar2 = 0x60;
  }
  if (algo16 != (uchar *)0x0) {
    uVar1 = *(undefined8 *)(algo16 + 8);
    *(undefined8 *)(keydata + uVar2) = *(undefined8 *)algo16;
    *(undefined8 *)(keydata + (ulong)uVar2 + 8) = uVar1;
    uVar2 = uVar2 | 0x10;
  }
  secp256k1_rfc6979_hmac_sha256_initialize(&rng,keydata,(ulong)uVar2);
  outlen = extraout_RDX;
  for (uVar2 = 0; uVar2 <= counter; uVar2 = uVar2 + 1) {
    secp256k1_rfc6979_hmac_sha256_generate(&rng,nonce32,outlen);
    outlen = extraout_RDX_00;
  }
  secp256k1_memclear(keydata,0x70);
  secp256k1_rfc6979_hmac_sha256_clear(&rng);
  return 1;
}

Assistant:

static int nonce_function_rfc6979(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
   unsigned char keydata[112];
   unsigned int offset = 0;
   secp256k1_rfc6979_hmac_sha256 rng;
   unsigned int i;
   secp256k1_scalar msg;
   unsigned char msgmod32[32];
   secp256k1_scalar_set_b32(&msg, msg32, NULL);
   secp256k1_scalar_get_b32(msgmod32, &msg);
   /* We feed a byte array to the PRNG as input, consisting of:
    * - the private key (32 bytes) and reduced message (32 bytes), see RFC 6979 3.2d.
    * - optionally 32 extra bytes of data, see RFC 6979 3.6 Additional Data.
    * - optionally 16 extra bytes with the algorithm name.
    * Because the arguments have distinct fixed lengths it is not possible for
    *  different argument mixtures to emulate each other and result in the same
    *  nonces.
    */
   buffer_append(keydata, &offset, key32, 32);
   buffer_append(keydata, &offset, msgmod32, 32);
   if (data != NULL) {
       buffer_append(keydata, &offset, data, 32);
   }
   if (algo16 != NULL) {
       buffer_append(keydata, &offset, algo16, 16);
   }
   secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, offset);
   for (i = 0; i <= counter; i++) {
       secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
   }
   secp256k1_rfc6979_hmac_sha256_finalize(&rng);

   secp256k1_memclear(keydata, sizeof(keydata));
   secp256k1_rfc6979_hmac_sha256_clear(&rng);
   return 1;
}